

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void rgb_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                    JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  ulong uVar5;
  JSAMPROW pJVar6;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    uVar1 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar3 = input_buf[1][input_row];
      pJVar4 = input_buf[2][input_row];
      input_row = input_row + 1;
      pJVar6 = *output_buf;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        *pJVar6 = pJVar2[uVar5];
        pJVar6[1] = pJVar3[uVar5];
        pJVar6[2] = pJVar4[uVar5];
        pJVar6 = pJVar6 + 3;
      }
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    uVar1 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar3 = input_buf[1][input_row];
      pJVar4 = input_buf[2][input_row];
      input_row = input_row + 1;
      pJVar6 = *output_buf;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        pJVar6[uVar5 * 4] = pJVar2[uVar5];
        pJVar6[uVar5 * 4 + 1] = pJVar3[uVar5];
        pJVar6[uVar5 * 4 + 2] = pJVar4[uVar5];
        pJVar6[uVar5 * 4 + 3] = 0xff;
      }
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_BGR:
    uVar1 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar3 = input_buf[1][input_row];
      pJVar4 = input_buf[2][input_row];
      input_row = input_row + 1;
      pJVar6 = *output_buf + 2;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        *pJVar6 = pJVar2[uVar5];
        pJVar6[-1] = pJVar3[uVar5];
        pJVar6[-2] = pJVar4[uVar5];
        pJVar6 = pJVar6 + 3;
      }
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    uVar1 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar3 = input_buf[1][input_row];
      pJVar4 = input_buf[2][input_row];
      input_row = input_row + 1;
      pJVar6 = *output_buf;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        pJVar6[uVar5 * 4 + 2] = pJVar2[uVar5];
        pJVar6[uVar5 * 4 + 1] = pJVar3[uVar5];
        pJVar6[uVar5 * 4] = pJVar4[uVar5];
        pJVar6[uVar5 * 4 + 3] = 0xff;
      }
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    uVar1 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar3 = input_buf[1][input_row];
      pJVar4 = input_buf[2][input_row];
      input_row = input_row + 1;
      pJVar6 = *output_buf;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        pJVar6[uVar5 * 4 + 3] = pJVar2[uVar5];
        pJVar6[uVar5 * 4 + 2] = pJVar3[uVar5];
        pJVar6[uVar5 * 4 + 1] = pJVar4[uVar5];
        pJVar6[uVar5 * 4] = 0xff;
      }
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    uVar1 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar3 = input_buf[1][input_row];
      pJVar4 = input_buf[2][input_row];
      input_row = input_row + 1;
      pJVar6 = *output_buf;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        pJVar6[uVar5 * 4 + 1] = pJVar2[uVar5];
        pJVar6[uVar5 * 4 + 2] = pJVar3[uVar5];
        pJVar6[uVar5 * 4 + 3] = pJVar4[uVar5];
        pJVar6[uVar5 * 4] = 0xff;
      }
      output_buf = output_buf + 1;
    }
    break;
  default:
    uVar1 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar3 = input_buf[1][input_row];
      pJVar4 = input_buf[2][input_row];
      input_row = input_row + 1;
      pJVar6 = *output_buf;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        *pJVar6 = pJVar2[uVar5];
        pJVar6[1] = pJVar3[uVar5];
        pJVar6[2] = pJVar4[uVar5];
        pJVar6 = pJVar6 + 3;
      }
      output_buf = output_buf + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_rgb_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    rgb_extrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    rgb_extrgbx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    rgb_extbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    rgb_extbgrx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    rgb_extxbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    rgb_extxrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  default:
    rgb_rgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                             num_rows);
    break;
  }
}